

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::getIOSubVariableLocation
              (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               *path,int startNdx,int currentLocation)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  VarType *pVVar4;
  StructType *pSVar5;
  StructMember *pSVar6;
  VarType *pVVar7;
  int local_24;
  int local_20;
  int ndx;
  int currentLocation_local;
  int startNdx_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  
  if (currentLocation == -1) {
    path_local._4_4_ = -1;
  }
  else {
    pvVar3 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::operator[](path,(long)startNdx);
    pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
    bVar1 = glu::VarType::isBasicType(pVVar4);
    path_local._4_4_ = currentLocation;
    if (!bVar1) {
      pvVar3 = std::
               vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               ::operator[](path,(long)startNdx);
      pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
      bVar1 = glu::VarType::isArrayType(pVVar4);
      if (bVar1) {
        path_local._4_4_ = getIOSubVariableLocation(path,startNdx + 1,currentLocation);
      }
      else {
        pvVar3 = std::
                 vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 ::operator[](path,(long)startNdx);
        pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
        bVar1 = glu::VarType::isStructType(pVVar4);
        if (bVar1) {
          local_24 = 0;
          local_20 = currentLocation;
          while( true ) {
            pvVar3 = std::
                     vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     ::operator[](path,(long)startNdx);
            pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
            pSVar5 = glu::VarType::getStructPtr(pVVar4);
            iVar2 = glu::StructType::getNumMembers(pSVar5);
            if (iVar2 <= local_24) break;
            pvVar3 = std::
                     vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     ::operator[](path,(long)startNdx);
            pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
            pSVar5 = glu::VarType::getStructPtr(pVVar4);
            pSVar6 = glu::StructType::getMember(pSVar5,local_24);
            pVVar4 = glu::StructMember::getType(pSVar6);
            pvVar3 = std::
                     vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     ::operator[](path,(long)(startNdx + 1));
            pVVar7 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
            if (pVVar4 == pVVar7) {
              iVar2 = getIOSubVariableLocation(path,startNdx + 1,local_20);
              return iVar2;
            }
            if (local_20 != -1) {
              pvVar3 = std::
                       vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                       ::operator[](path,(long)startNdx);
              pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar3);
              pSVar5 = glu::VarType::getStructPtr(pVVar4);
              pSVar6 = glu::StructType::getMember(pSVar5,local_24);
              pVVar4 = glu::StructMember::getType(pSVar6);
              iVar2 = getVariableLocationLength(pVVar4);
              local_20 = iVar2 + local_20;
            }
            local_24 = local_24 + 1;
          }
          path_local._4_4_ = -1;
        }
        else {
          path_local._4_4_ = -1;
        }
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

static int getIOSubVariableLocation (const std::vector<VariablePathComponent>& path, int startNdx, int currentLocation)
{
	if (currentLocation == -1)
		return -1;

	if (path[startNdx].getVariableType()->isBasicType())
		return currentLocation;
	else if (path[startNdx].getVariableType()->isArrayType())
		return getIOSubVariableLocation(path, startNdx+1, currentLocation);
	else if (path[startNdx].getVariableType()->isStructType())
	{
		for (int ndx = 0; ndx < path[startNdx].getVariableType()->getStructPtr()->getNumMembers(); ++ndx)
		{
			if (&path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType() == path[startNdx + 1].getVariableType())
				return getIOSubVariableLocation(path, startNdx + 1, currentLocation);

			if (currentLocation != -1)
				currentLocation += getVariableLocationLength(path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType());
		}

		// could not find member, never happens
		DE_ASSERT(false);
		return -1;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}